

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

void pybind11::detail::translate_exception(exception_ptr *p)

{
  PyObject *pPVar1;
  bool bVar2;
  undefined8 uVar3;
  error_already_set *exc;
  long *plVar4;
  bad_alloc *exc_00;
  char *pcVar5;
  domain_error *exc_01;
  invalid_argument *exc_02;
  length_error *exc_03;
  out_of_range *exc_04;
  range_error *exc_05;
  overflow_error *exc_06;
  exception *exc_07;
  nested_exception *exc_08;
  int iVar6;
  undefined1 auVar7 [12];
  nested_exception *local_b0;
  error_already_set *e;
  nested_exception *nep;
  builtin_exception *e_1;
  bad_alloc *e_2;
  domain_error *e_3;
  invalid_argument *e_4;
  length_error *e_5;
  out_of_range *e_6;
  range_error *e_7;
  overflow_error *e_8;
  exception *e_9;
  nested_exception *e_10;
  exception_ptr local_18;
  exception_ptr *local_10;
  exception_ptr *p_local;
  
  local_10 = p;
  bVar2 = std::__exception_ptr::exception_ptr::operator_cast_to_bool(p);
  if (bVar2) {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_18,p);
    auVar7 = std::rethrow_exception((exception_ptr)&local_18);
    iVar6 = auVar7._8_4_;
    uVar3 = auVar7._0_8_;
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_18);
    if (iVar6 == 0xc) {
      exc = (error_already_set *)__cxa_begin_catch(uVar3);
      handle_nested_exception<pybind11::error_already_set,_0>(exc,p);
      error_already_set::restore(exc);
      __cxa_end_catch();
    }
    else if (iVar6 == 0xb) {
      plVar4 = (long *)__cxa_begin_catch(uVar3);
      if (plVar4 == (long *)0x0) {
        local_b0 = (nested_exception *)0x0;
      }
      else {
        local_b0 = (nested_exception *)
                   __dynamic_cast(plVar4,&builtin_exception::typeinfo,
                                  &std::nested_exception::typeinfo,0xfffffffffffffffe);
      }
      if (local_b0 != (nested_exception *)0x0) {
        handle_nested_exception<std::nested_exception,_0>(local_b0,p);
      }
      (**(code **)(*plVar4 + 0x18))();
      __cxa_end_catch();
    }
    else if (iVar6 == 10) {
      exc_00 = (bad_alloc *)__cxa_begin_catch(uVar3);
      handle_nested_exception<std::bad_alloc,_0>(exc_00,p);
      pPVar1 = _PyExc_MemoryError;
      pcVar5 = (char *)(**(code **)(*(long *)exc_00 + 0x10))();
      raise_err(pPVar1,pcVar5);
      __cxa_end_catch();
    }
    else if (iVar6 == 9) {
      exc_01 = (domain_error *)__cxa_begin_catch(uVar3);
      handle_nested_exception<std::domain_error,_0>(exc_01,p);
      pPVar1 = _PyExc_ValueError;
      pcVar5 = (char *)(**(code **)(*(long *)exc_01 + 0x10))();
      raise_err(pPVar1,pcVar5);
      __cxa_end_catch();
    }
    else if (iVar6 == 8) {
      exc_02 = (invalid_argument *)__cxa_begin_catch(uVar3);
      handle_nested_exception<std::invalid_argument,_0>(exc_02,p);
      pPVar1 = _PyExc_ValueError;
      pcVar5 = (char *)(**(code **)(*(long *)exc_02 + 0x10))();
      raise_err(pPVar1,pcVar5);
      __cxa_end_catch();
    }
    else if (iVar6 == 7) {
      exc_03 = (length_error *)__cxa_begin_catch(uVar3);
      handle_nested_exception<std::length_error,_0>(exc_03,p);
      pPVar1 = _PyExc_ValueError;
      pcVar5 = (char *)(**(code **)(*(long *)exc_03 + 0x10))();
      raise_err(pPVar1,pcVar5);
      __cxa_end_catch();
    }
    else if (iVar6 == 6) {
      exc_04 = (out_of_range *)__cxa_begin_catch(uVar3);
      handle_nested_exception<std::out_of_range,_0>(exc_04,p);
      pPVar1 = _PyExc_IndexError;
      pcVar5 = (char *)(**(code **)(*(long *)exc_04 + 0x10))();
      raise_err(pPVar1,pcVar5);
      __cxa_end_catch();
    }
    else if (iVar6 == 5) {
      exc_05 = (range_error *)__cxa_begin_catch(uVar3);
      handle_nested_exception<std::range_error,_0>(exc_05,p);
      pPVar1 = _PyExc_ValueError;
      pcVar5 = (char *)(**(code **)(*(long *)exc_05 + 0x10))();
      raise_err(pPVar1,pcVar5);
      __cxa_end_catch();
    }
    else if (iVar6 == 4) {
      exc_06 = (overflow_error *)__cxa_begin_catch(uVar3);
      handle_nested_exception<std::overflow_error,_0>(exc_06,p);
      pPVar1 = _PyExc_OverflowError;
      pcVar5 = (char *)(**(code **)(*(long *)exc_06 + 0x10))();
      raise_err(pPVar1,pcVar5);
      __cxa_end_catch();
    }
    else if (iVar6 == 3) {
      exc_07 = (exception *)__cxa_begin_catch(uVar3);
      handle_nested_exception<std::exception,_0>(exc_07,p);
      pPVar1 = _PyExc_RuntimeError;
      pcVar5 = (char *)(**(code **)(*(long *)exc_07 + 0x10))();
      raise_err(pPVar1,pcVar5);
      __cxa_end_catch();
    }
    else if (iVar6 == 2) {
      exc_08 = (nested_exception *)__cxa_begin_catch(uVar3);
      handle_nested_exception<std::nested_exception,_0>(exc_08,p);
      raise_err(_PyExc_RuntimeError,"Caught an unknown nested exception!");
      __cxa_end_catch();
    }
    else {
      __cxa_begin_catch(uVar3);
      raise_err(_PyExc_RuntimeError,"Caught an unknown exception!");
      __cxa_end_catch();
    }
  }
  return;
}

Assistant:

inline void translate_exception(std::exception_ptr p) {
    if (!p) {
        return;
    }
    try {
        std::rethrow_exception(p);
    } catch (error_already_set &e) {
        handle_nested_exception(e, p);
        e.restore();
        return;
    } catch (const builtin_exception &e) {
        // Could not use template since it's an abstract class.
        if (const auto *nep = dynamic_cast<const std::nested_exception *>(std::addressof(e))) {
            handle_nested_exception(*nep, p);
        }
        e.set_error();
        return;
    } catch (const std::bad_alloc &e) {
        handle_nested_exception(e, p);
        raise_err(PyExc_MemoryError, e.what());
        return;
    } catch (const std::domain_error &e) {
        handle_nested_exception(e, p);
        raise_err(PyExc_ValueError, e.what());
        return;
    } catch (const std::invalid_argument &e) {
        handle_nested_exception(e, p);
        raise_err(PyExc_ValueError, e.what());
        return;
    } catch (const std::length_error &e) {
        handle_nested_exception(e, p);
        raise_err(PyExc_ValueError, e.what());
        return;
    } catch (const std::out_of_range &e) {
        handle_nested_exception(e, p);
        raise_err(PyExc_IndexError, e.what());
        return;
    } catch (const std::range_error &e) {
        handle_nested_exception(e, p);
        raise_err(PyExc_ValueError, e.what());
        return;
    } catch (const std::overflow_error &e) {
        handle_nested_exception(e, p);
        raise_err(PyExc_OverflowError, e.what());
        return;
    } catch (const std::exception &e) {
        handle_nested_exception(e, p);
        raise_err(PyExc_RuntimeError, e.what());
        return;
    } catch (const std::nested_exception &e) {
        handle_nested_exception(e, p);
        raise_err(PyExc_RuntimeError, "Caught an unknown nested exception!");
        return;
    } catch (...) {
        raise_err(PyExc_RuntimeError, "Caught an unknown exception!");
        return;
    }
}